

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void tree_print_snode(lyout *out,int level,uint16_t max_name_len,lys_node *node,int mask,
                     lys_node *aug_parent,int subtree,tp_opts *opts)

{
  long lVar1;
  char cVar2;
  char cVar3;
  int level_00;
  lyout *out_00;
  LYS_NODE LVar4;
  int iVar5;
  lys_node *plVar6;
  size_t sVar7;
  bool bVar8;
  char *local_78;
  lys_node *local_50;
  char *text_str;
  uint16_t max_child_len;
  uint8_t text_indent;
  uint8_t text_len;
  int child_mask;
  int node_len;
  int line_len;
  lys_node *sub;
  lys_node *aug_parent_local;
  lys_node *plStack_20;
  int mask_local;
  lys_node *node_local;
  uint16_t max_name_len_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  bVar8 = false;
  if (node->parent != (lys_node *)0x0) {
    bVar8 = node->parent->nodetype == LYS_AUGMENT;
  }
  sub = aug_parent;
  aug_parent_local._4_4_ = mask;
  plStack_20 = node;
  node_local._2_2_ = max_name_len;
  node_local._4_4_ = level;
  plStack_10 = out;
  plVar6 = lys_is_disabled(node,(uint)bVar8);
  if (plVar6 != (lys_node *)0x0) {
    return;
  }
  if ((plStack_20->nodetype & aug_parent_local._4_4_) == LYS_UNKNOWN) {
    return;
  }
  if (((plStack_20->nodetype & aug_parent_local._4_4_ & (LYS_OUTPUT|LYS_INPUT|LYS_CASE)) !=
       LYS_UNKNOWN) && ((plStack_20->flags & 0x40) != 0)) {
    if (plStack_20->nodetype != LYS_CASE) {
      return;
    }
    plVar6 = lys_is_disabled(plStack_20->child,0);
    if (plVar6 != (lys_node *)0x0) {
      return;
    }
  }
  LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
  if (LVar4 == LYS_ANYXML) {
    plVar6 = lys_parent(plStack_20);
    if ((plVar6 == (lys_node *)0x0) &&
       ((iVar5 = strcmp(plStack_20->name,"config"), iVar5 == 0 &&
        (iVar5 = strcmp(plStack_20->module->name,"ietf-netconf"), iVar5 == 0)))) {
      return;
    }
LAB_001ded59:
    child_mask = tree_print_indent(plStack_10,node_local._4_4_,opts);
    if ((plStack_20->flags & 0x10) == 0) {
      local_78 = "+";
      if ((plStack_20->flags & 0x20) != 0) {
        local_78 = "o";
      }
    }
    else {
      local_78 = "x";
    }
    iVar5 = ly_print(plStack_10,"%s--",local_78);
    child_mask = child_mask + iVar5;
    iVar5 = tree_print_config(plStack_10,plStack_20,opts->spec_config);
    child_mask = child_mask + iVar5;
    _max_child_len = tree_print_prefix(plStack_10,plStack_20,opts);
    iVar5 = ly_print(plStack_10,plStack_20->name);
    _max_child_len = _max_child_len + iVar5;
    LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
    if (LVar4 == LYS_CONTAINER) {
      lVar1._0_2_ = plStack_20[1].flags;
      lVar1._2_1_ = plStack_20[1].ext_size;
      lVar1._3_1_ = plStack_20[1].iffeature_size;
      lVar1._4_1_ = plStack_20[1].padding[0];
      lVar1._5_1_ = plStack_20[1].padding[1];
      lVar1._6_1_ = plStack_20[1].padding[2];
      lVar1._7_1_ = plStack_20[1].padding[3];
      if (lVar1 != 0) {
        iVar5 = ly_print(plStack_10,"!");
        _max_child_len = iVar5 + _max_child_len;
      }
    }
    else if (LVar4 == LYS_CHOICE) {
      iVar5 = ly_print(plStack_10,")");
      _max_child_len = iVar5 + _max_child_len;
      if ((plStack_20->flags & 0x40) == 0) {
        iVar5 = ly_print(plStack_10,"?");
        _max_child_len = iVar5 + _max_child_len;
      }
    }
    else if (LVar4 == LYS_LEAF) {
      if (((plStack_20->flags & 0x40) == 0) &&
         (iVar5 = tree_leaf_is_mandatory(plStack_20), iVar5 == 0)) {
        iVar5 = ly_print(plStack_10,"?");
        _max_child_len = iVar5 + _max_child_len;
      }
    }
    else if ((LVar4 == LYS_LEAFLIST) || (LVar4 == LYS_LIST)) {
      iVar5 = ly_print(plStack_10,"*");
      _max_child_len = iVar5 + _max_child_len;
    }
    else if (LVar4 == LYS_ANYXML) {
LAB_001deed9:
      if ((plStack_20->flags & 0x40) == 0) {
        iVar5 = ly_print(plStack_10,"?");
        _max_child_len = iVar5 + _max_child_len;
      }
    }
    else if (LVar4 == LYS_CASE) {
      iVar5 = ly_print(plStack_10,")");
      _max_child_len = iVar5 + _max_child_len;
    }
    else if (LVar4 == LYS_ANYDATA) goto LAB_001deed9;
    child_mask = _max_child_len + child_mask;
    node_local._4_4_ = node_local._4_4_ + 1;
    if (subtree == 0) {
      tree_next_indent(node_local._4_4_,plStack_20,sub,opts);
    }
    LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
    cVar2 = (char)node_local._2_2_;
    cVar3 = (char)_max_child_len;
    if ((LVar4 == LYS_LEAF) || (LVar4 == LYS_LEAFLIST)) {
      if (node_local._2_2_ == 0) {
        __assert_fail("max_name_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                      ,0x25c,
                      "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                     );
      }
      text_str._2_1_ = (cVar2 - cVar3) + '\x03';
      iVar5 = tree_print_type(plStack_10,(lys_type *)&plStack_20[1].ref,opts->options,
                              (char **)&local_50);
      text_str._3_1_ = (byte)iVar5;
      child_mask = tree_print_wrap(plStack_10,node_local._4_4_,child_mask,text_str._2_1_,
                                   (ushort)text_str._3_1_,opts);
      iVar5 = ly_print(plStack_10,(char *)local_50);
      child_mask = iVar5 + child_mask;
      lydict_remove(opts->module->ctx,(char *)local_50);
    }
    else if (LVar4 == LYS_LIST) {
      iVar5 = tree_print_keys(plStack_10,*(lys_node_leaf ***)&plStack_20[1].flags,
                              plStack_20->padding[2],opts,(char **)&local_50);
      text_str._3_1_ = (byte)iVar5;
      if (text_str._3_1_ != 0) {
        child_mask = tree_print_wrap(plStack_10,node_local._4_4_,child_mask,'\x01',
                                     (ushort)text_str._3_1_,opts);
        iVar5 = ly_print(plStack_10,(char *)local_50);
        child_mask = iVar5 + child_mask;
        lydict_remove(opts->module->ctx,(char *)local_50);
      }
    }
    else if (LVar4 == LYS_ANYXML) {
      if (node_local._2_2_ == 0) {
        __assert_fail("max_name_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                      ,0x26a,
                      "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                     );
      }
      text_str._2_1_ = (cVar2 - cVar3) + '\x03';
      child_mask = tree_print_wrap(plStack_10,node_local._4_4_,child_mask,text_str._2_1_,6,opts);
      iVar5 = ly_print(plStack_10,"anyxml");
      child_mask = iVar5 + child_mask;
    }
    else if (LVar4 == LYS_ANYDATA) {
      if (node_local._2_2_ == 0) {
        __assert_fail("max_name_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                      ,0x264,
                      "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                     );
      }
      text_str._2_1_ = (cVar2 - cVar3) + '\x03';
      child_mask = tree_print_wrap(plStack_10,node_local._4_4_,child_mask,text_str._2_1_,7,opts);
      iVar5 = ly_print(plStack_10,"anydata");
      child_mask = iVar5 + child_mask;
    }
    out_00 = plStack_10;
    level_00 = node_local._4_4_;
    iVar5 = child_mask;
    if ((opts->options & 1U) == 0) {
      LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
      if (LVar4 == LYS_CHOICE) {
        _node_len = (lys_node *)plStack_20[1].name;
        if (_node_len != (lys_node *)0x0) {
          sVar7 = strlen(*(char **)_node_len);
          child_mask = tree_print_wrap(out_00,level_00,iVar5,'\x01',(short)sVar7 + 2,opts);
          iVar5 = ly_print(plStack_10,"<%s>",_node_len->name);
          child_mask = iVar5 + child_mask;
        }
      }
      else if ((LVar4 == LYS_LEAF) && (local_50 = plStack_20[1].prev, local_50 != (lys_node *)0x0))
      {
        sVar7 = strlen((char *)local_50);
        child_mask = tree_print_wrap(out_00,level_00,iVar5,'\x01',(short)sVar7 + 2,opts);
        iVar5 = ly_print(plStack_10,"<%s>",local_50);
        child_mask = iVar5 + child_mask;
      }
    }
    LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
    if (((((LVar4 - LYS_CONTAINER < 2) || (LVar4 == LYS_LEAF)) || (LVar4 == LYS_LEAFLIST)) ||
        ((((LVar4 == LYS_LIST || (LVar4 == LYS_ANYXML)) ||
          ((LVar4 == LYS_CASE || ((LVar4 == LYS_NOTIF || (LVar4 == LYS_RPC)))))) ||
         (LVar4 == LYS_USES)))) || ((LVar4 == LYS_ACTION || (LVar4 == LYS_ANYDATA)))) {
      if ((plStack_20->parent == (lys_node *)0x0) || (plStack_20->parent->nodetype != LYS_AUGMENT))
      {
        iVar5 = tree_print_features(plStack_10,plStack_20->iffeature,plStack_20->iffeature_size,
                                    (lys_iffeature *)0x0,'\0',opts,(char **)&local_50);
        text_str._3_1_ = (byte)iVar5;
      }
      else {
        iVar5 = tree_print_features(plStack_10,plStack_20->iffeature,plStack_20->iffeature_size,
                                    plStack_20->parent->iffeature,plStack_20->parent->iffeature_size
                                    ,opts,(char **)&local_50);
        text_str._3_1_ = (byte)iVar5;
      }
      if (text_str._3_1_ != 0) {
        child_mask = tree_print_wrap(plStack_10,node_local._4_4_,child_mask,'\x01',
                                     (ushort)text_str._3_1_,opts);
        iVar5 = ly_print(plStack_10,(char *)local_50);
        child_mask = iVar5 + child_mask;
        lydict_remove(opts->module->ctx,(char *)local_50);
      }
    }
    ly_print(plStack_10,"\n");
    if (subtree == 1) {
      return;
    }
    if ((plStack_20->nodetype & aug_parent_local._4_4_) == LYS_USES) {
      return;
    }
    LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
    if (LVar4 == LYS_NOTIF) {
LAB_001df597:
      opts->spec_config = 2;
    }
    else if (LVar4 == LYS_INPUT) {
      opts->spec_config = 1;
    }
    else if (LVar4 == LYS_OUTPUT) goto LAB_001df597;
  }
  else if ((LVar4 != LYS_GROUPING) && ((LVar4 != LYS_USES || ((opts->options & 4U) != 0))))
  goto LAB_001ded59;
  LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
  if (LVar4 == LYS_CONTAINER) {
LAB_001df769:
    text_str._4_4_ = 0xd0bf;
    text_str._0_2_ = tree_get_max_name_len(plStack_20->child,(lys_node *)0x0,0xd0bf,opts);
  }
  else {
    if (LVar4 == LYS_CHOICE) {
      text_str._4_4_ = 0x807d;
      text_str._0_2_ = tree_get_max_name_len(plStack_20->child,(lys_node *)0x0,0x807d,opts);
      goto LAB_001df7c8;
    }
    if ((LVar4 != LYS_LEAF) && (LVar4 != LYS_LEAFLIST)) {
      if (LVar4 == LYS_LIST) goto LAB_001df769;
      if (LVar4 != LYS_ANYXML) {
        if ((LVar4 == LYS_CASE) || (LVar4 == LYS_NOTIF)) {
          text_str._4_4_ = 0x903f;
          text_str._0_2_ = tree_get_max_name_len(plStack_20->child,(lys_node *)0x0,0x903f,opts);
          goto LAB_001df7c8;
        }
        if (LVar4 != LYS_RPC) {
          if ((LVar4 == LYS_INPUT) || (LVar4 == LYS_OUTPUT)) {
            text_str._4_4_ = 0x903f;
            text_str._0_2_ = tree_get_max_name_len(plStack_20->child,(lys_node *)0x0,0x903f,opts);
            goto LAB_001df7c8;
          }
          if (LVar4 == LYS_GROUPING) goto LAB_001df769;
          if (LVar4 == LYS_USES) {
            text_str._4_4_ = 0xd0bf;
            text_str._0_2_ = node_local._2_2_;
            goto LAB_001df7c8;
          }
          if (LVar4 != LYS_ACTION) {
            if (LVar4 != LYS_ANYDATA) {
              text_str._4_4_ = 0;
              text_str._0_2_ = 0;
              ly_log(plStack_20->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                    );
              goto LAB_001df7c8;
            }
            goto LAB_001df6bf;
          }
        }
        text_str._4_4_ = 0x600;
        text_str._0_2_ = 0;
        goto LAB_001df7c8;
      }
    }
LAB_001df6bf:
    text_str._4_4_ = 0;
    text_str._0_2_ = 0;
  }
LAB_001df7c8:
  if (text_str._4_4_ != 0) {
    for (_node_len = plStack_20->child; _node_len != (lys_node *)0x0; _node_len = _node_len->next) {
      if ((((*(ushort *)&opts->module->field_0x40 & 1) == 0) || (_node_len->parent == plStack_20))
         || (_node_len->module == opts->module)) {
        tree_print_snode(plStack_10,node_local._4_4_,(uint16_t)text_str,_node_len,text_str._4_4_,
                         (lys_node *)0x0,0,opts);
      }
    }
  }
  LVar4 = plStack_20->nodetype & aug_parent_local._4_4_;
  if (((LVar4 == LYS_NOTIF) || (LVar4 == LYS_INPUT)) || (LVar4 == LYS_OUTPUT)) {
    opts->spec_config = 0;
  }
  return;
}

Assistant:

static void
tree_print_snode(struct lyout *out, int level, uint16_t max_name_len, const struct lys_node *node, int mask,
                 const struct lys_node *aug_parent, int subtree, tp_opts *opts)
{
    struct lys_node *sub;
    int line_len, node_len, child_mask;
    uint8_t text_len, text_indent;
    uint16_t max_child_len;
    const char *text_str;

    /* disabled/not printed node */
    if (lys_is_disabled(node, (node->parent && node->parent->nodetype == LYS_AUGMENT) ? 1 : 0) || !(node->nodetype & mask)) {
        return;
    }

    /* implicit input/output/case */
    if (((node->nodetype & mask) & (LYS_INPUT | LYS_OUTPUT | LYS_CASE)) && (node->flags & LYS_IMPLICIT)) {
        if ((node->nodetype != LYS_CASE) || lys_is_disabled(node->child, 0)) {
            return;
        }
    }

    /* special uses and grouping handling */
    switch (node->nodetype & mask) {
    case LYS_USES:
        if (opts->options & LYS_OUTOPT_TREE_USES) {
            break;
        }
        /* fallthrough */
    case LYS_GROUPING:
        goto print_children;
    case LYS_ANYXML:
        if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
            /* node added by libyang, not actually in the model */
            return;
        }
        break;
    default:
        break;
    }

    /* print indent */
    line_len = tree_print_indent(out, level, opts);
    /* print status */
    line_len += ly_print(out, "%s--", (node->flags & LYS_STATUS_DEPRC ? "x" : (node->flags & LYS_STATUS_OBSLT ? "o" : "+")));
    /* print config flags (or special opening for case, choice) */
    line_len += tree_print_config(out, node, opts->spec_config);
    /* print optionally prefix */
    node_len = tree_print_prefix(out, node, opts);
    /* print name */
    node_len += ly_print(out, node->name);

    /* print one-character opts */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
        if (!(node->flags & LYS_MAND_TRUE) && !tree_leaf_is_mandatory(node)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->presence) {
            node_len += ly_print(out, "!");
        }
        break;
    case LYS_LIST:
    case LYS_LEAFLIST:
        node_len += ly_print(out, "*");
        break;
    case LYS_CASE:
        /* kinda shady, but consistent in a way */
        node_len += ly_print(out, ")");
        break;
    case LYS_CHOICE:
        node_len += ly_print(out, ")");
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    default:
        break;
    }
    line_len += node_len;

    /**
     * wrapped print
     */

    /* learn next level indent (there is never a sibling for subtree) */
    ++level;
    if (!subtree) {
        tree_next_indent(level, node, aug_parent, opts);
    }

    /* print type/keys */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        text_len = tree_print_type(out, &((struct lys_node_leaf *)node)->type, opts->options, &text_str);
        line_len = tree_print_wrap(out, level, line_len, text_indent, text_len, opts);
        line_len += ly_print(out, text_str);
        lydict_remove(opts->module->ctx, text_str);
        break;
    case LYS_ANYDATA:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 7, opts);
        line_len += ly_print(out, "anydata");
        break;
    case LYS_ANYXML:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 6, opts);
        line_len += ly_print(out, "anyxml");
        break;
    case LYS_LIST:
        text_len = tree_print_keys(out, ((struct lys_node_list *)node)->keys, ((struct lys_node_list *)node)->keys_size,
                                   opts, &text_str);
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        break;
    }

    /* print default */
    if (!(opts->options & LYS_OUTOPT_TREE_RFC)) {
        switch (node->nodetype & mask) {
        case LYS_LEAF:
            text_str = ((struct lys_node_leaf *)node)->dflt;
            if (text_str) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(text_str), opts);
                line_len += ly_print(out, "<%s>", text_str);
            }
            break;
        case LYS_CHOICE:
            sub = ((struct lys_node_choice *)node)->dflt;
            if (sub) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(sub->name), opts);
                line_len += ly_print(out, "<%s>", sub->name);
            }
            break;
        default:
            break;
        }
    }

    /* print if-features */
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_CASE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
    case LYS_USES:
        if (node->parent && (node->parent->nodetype == LYS_AUGMENT)) {
            /* if-features from an augment are de facto inherited */
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size,
                                           node->parent->iffeature, node->parent->iffeature_size, opts, &text_str);
        } else {
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size, NULL, 0, opts, &text_str);
        }
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        /* only grouping */
        break;
    }

    /* this node is finished printing */
    ly_print(out, "\n");

    if ((subtree == 1) || ((node->nodetype & mask) == LYS_USES)) {
        /* we are printing subtree parents, finish here (or uses option) */
        return;
    }

    /* set special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
        opts->spec_config = 1;
        break;
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 2;
        break;
    default:
        break;
    }

print_children:
    /* set child mask and learn the longest child name (needed only if a child can have type) */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        child_mask = 0;
        max_child_len = 0;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        child_mask = LYS_INPUT | LYS_OUTPUT;
        max_child_len = 0;
        break;
    case LYS_CHOICE:
        child_mask = LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_CASE:
    case LYS_NOTIF:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_USES:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        /* inherit the name length from the parent, it does not change */
        max_child_len = max_name_len;
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    default:
        child_mask = 0;
        max_child_len = 0;
        LOGINT(node->module->ctx);
        break;
    }

    /* print descendants (children) */
    if (child_mask) {
        LY_TREE_FOR(node->child, sub) {
            /* submodule, foreign augments */
            if (opts->module->type && (sub->parent != node) && (sub->module != opts->module)) {
                continue;
            }
            tree_print_snode(out, level, max_child_len, sub, child_mask, NULL, 0, opts);
        }
    }

    /* reset special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 0;
        break;
    default:
        break;
    }
}